

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

int t_pool_flush(t_pool *p)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  long lVar2;
  
  __mutex = &p->pool_m;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  lVar2 = 0x18;
  for (lVar1 = 0; lVar1 < p->tsize; lVar1 = lVar1 + 1) {
    if (p->t_stack[lVar1] != 0) {
      pthread_cond_signal((pthread_cond_t *)((long)&p->t->p + lVar2));
    }
    lVar2 = lVar2 + 0x50;
  }
  while ((p->njobs != 0 || (p->nwaiting != p->tsize))) {
    pthread_cond_wait((pthread_cond_t *)&p->empty_c,(pthread_mutex_t *)__mutex);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return 0;
}

Assistant:

int t_pool_flush(t_pool *p) {
    int i;

#ifdef DEBUG
    fprintf(stderr, "Flushing pool %p\n", p);
#endif

    // Drains the queue
    pthread_mutex_lock(&p->pool_m);

    // Wake up everything for the final sprint!
    for (i = 0; i < p->tsize; i++)
	if (p->t_stack[i])
	    pthread_cond_signal(&p->t[i].pending_c);

    while (p->njobs || p->nwaiting != p->tsize)
	pthread_cond_wait(&p->empty_c, &p->pool_m);

    pthread_mutex_unlock(&p->pool_m);

#ifdef DEBUG
    fprintf(stderr, "Flushed complete for pool %p, njobs=%d, nwaiting=%d\n",
	    p, p->njobs, p->nwaiting);
#endif

    return 0;
}